

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O3

uint32 __thiscall
Protocol::MQTT::V5::WillMessage::readFrom(WillMessage *this,uint8 *buffer,uint32 bufLength)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  
  uVar1 = Properties::readFrom(&this->willProperties,buffer,bufLength);
  uVar3 = uVar1;
  if (uVar1 < 0xfffffffd) {
    uVar2 = Common::DynamicString::readFrom(&this->willTopic,buffer + uVar1,bufLength - uVar1);
    uVar3 = uVar2;
    if ((uVar2 < 0xfffffffd) &&
       (uVar3 = Common::DynamicBinaryData::readFrom
                          (&this->willPayload,buffer + uVar1 + uVar2,(bufLength - uVar1) - uVar2),
       uVar3 < 0xfffffffd)) {
      uVar3 = uVar2 + uVar1 + uVar3;
    }
  }
  return uVar3;
}

Assistant:

virtual uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 s = willProperties.readFrom(buffer, bufLength), o = 0;
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    s = willTopic.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    s = willPayload.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s;
                    return o;
                }